

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O3

void __thiscall ASDCP::JP2K::MXFSReader::~MXFSReader(MXFSReader *this)

{
  h__SReader *phVar1;
  char cVar2;
  Result_t local_70 [104];
  
  this->_vptr_MXFSReader = (_func_int **)&PTR__MXFSReader_00225f70;
  phVar1 = (this->m_Reader).m_p;
  if (phVar1 != (h__SReader *)0x0) {
    cVar2 = (**(code **)(*(long *)(phVar1->super_lh__Reader).super_h__ASDCPReader.
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if (cVar2 != '\0') {
      (**(code **)(*(long *)(((this->m_Reader).m_p)->super_lh__Reader).super_h__ASDCPReader.
                            super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                            .m_File + 0x18))(local_70);
      Kumu::Result_t::~Result_t(local_70);
    }
    phVar1 = (this->m_Reader).m_p;
    if (phVar1 != (h__SReader *)0x0) {
      (*(phVar1->super_lh__Reader).super_h__ASDCPReader.
        super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
        _vptr_TrackFileReader[1])();
    }
  }
  return;
}

Assistant:

ASDCP::JP2K::MXFSReader::~MXFSReader()
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    m_Reader->Close();
}